

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
__thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateVector<MyGame::Example::Referrable>
          (FlatBufferBuilderImpl<false> *this,Offset<MyGame::Example::Referrable> *v,size_t len)

{
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_> OVar1
  ;
  size_t sVar2;
  bool bVar3;
  
  StartVector<flatbuffers::Offset<MyGame::Example::Referrable>,flatbuffers::Offset,unsigned_int>
            (this,len);
  sVar2 = len;
  while (bVar3 = sVar2 != 0, sVar2 = sVar2 - 1, bVar3) {
    PushElement<MyGame::Example::Referrable,flatbuffers::Offset>
              (this,(Offset<MyGame::Example::Referrable>)v[sVar2].o);
  }
  OVar1.o = EndVector<unsigned_int,unsigned_int>(this,len);
  return (Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
          )OVar1.o;
}

Assistant:

Offset<Vector<Offset<T>>> CreateVector(const Offset<T> *v, size_t len) {
    StartVector<Offset<T>>(len);
    for (auto i = len; i > 0;) { PushElement(v[--i]); }
    return Offset<Vector<Offset<T>>>(EndVector(len));
  }